

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool gen_shift(DisasContext_conflict12 *ctx,arg_r_conflict *a,
               _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_conflict11 *func)

{
  undefined1 extraout_AL;
  TCGTemp *a1;
  TCGTemp *a1_00;
  uintptr_t o;
  TCGv_i64 pTVar1;
  uintptr_t o_4;
  TCGv_i64 pTVar2;
  TCGOpcode TVar3;
  uintptr_t o_3;
  TCGv_i64 pTVar4;
  
  a1 = tcg_temp_new_internal_riscv64((TCGContext_conflict11 *)ctx,TCG_TYPE_I64,false);
  pTVar4 = (TCGv_i64)((long)a1 - (long)ctx);
  a1_00 = tcg_temp_new_internal_riscv64((TCGContext_conflict11 *)ctx,TCG_TYPE_I64,false);
  if ((long)a->rs1 == 0) {
    TVar3 = INDEX_op_movi_i64;
    pTVar2 = (TCGv_i64)0x0;
LAB_00c727eb:
    tcg_gen_op2_riscv64((TCGContext_conflict11 *)ctx,TVar3,(TCGArg)a1,(TCGArg)pTVar2);
  }
  else {
    pTVar2 = (TCGv_i64)(&ctx[0x158].base.pc_next)[a->rs1];
    if (pTVar2 != pTVar4) {
      pTVar2 = pTVar2 + (long)&(ctx->base).tb;
      TVar3 = INDEX_op_mov_i64;
      goto LAB_00c727eb;
    }
  }
  pTVar2 = (TCGv_i64)((long)a1_00 - (long)ctx);
  if ((long)a->rs2 == 0) {
    TVar3 = INDEX_op_movi_i64;
    pTVar1 = (TCGv_i64)0x0;
  }
  else {
    pTVar1 = (TCGv_i64)(&ctx[0x158].base.pc_next)[a->rs2];
    if (pTVar1 == pTVar2) goto LAB_00c7282f;
    pTVar1 = pTVar1 + (long)ctx;
    TVar3 = INDEX_op_mov_i64;
  }
  tcg_gen_op2_riscv64((TCGContext_conflict11 *)ctx,TVar3,(TCGArg)a1_00,(TCGArg)pTVar1);
LAB_00c7282f:
  tcg_gen_andi_i64_riscv64((TCGContext_conflict11 *)ctx,pTVar2,pTVar2,0x3f);
  (*func)((TCGContext_conflict11 *)ctx,pTVar4,pTVar4,pTVar2);
  if (((long)a->rd != 0) && (pTVar1 = (TCGv_i64)(&ctx[0x158].base.pc_next)[a->rd], pTVar1 != pTVar4)
     ) {
    tcg_gen_op2_riscv64((TCGContext_conflict11 *)ctx,INDEX_op_mov_i64,
                        (TCGArg)(pTVar1 + (long)&(ctx->base).tb),(TCGArg)a1);
  }
  tcg_temp_free_internal_riscv64((TCGContext_conflict11 *)ctx,(TCGTemp *)(pTVar4 + (long)ctx));
  tcg_temp_free_internal_riscv64((TCGContext_conflict11 *)ctx,(TCGTemp *)(pTVar2 + (long)ctx));
  return (_Bool)extraout_AL;
}

Assistant:

static void gen_shift(DisasContext *ctx, uint32_t opc,
                      int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    if (rd == 0) {
        /*
         * If no destination, treat it as a NOP.
         * For add & sub, we must generate the overflow exception when needed.
         */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);
    switch (opc) {
    case OPC_SLLV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x1f);
        tcg_gen_shl_tl(tcg_ctx, t0, t1, t0);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
        break;
    case OPC_SRAV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x1f);
        tcg_gen_sar_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
        break;
    case OPC_SRLV:
        tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x1f);
        tcg_gen_shr_tl(tcg_ctx, t0, t1, t0);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
        break;
    case OPC_ROTRV:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);

            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_andi_i32(tcg_ctx, t2, t2, 0x1f);
            tcg_gen_rotr_i32(tcg_ctx, t2, t3, t2);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DSLLV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x3f);
        tcg_gen_shl_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
        break;
    case OPC_DSRAV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x3f);
        tcg_gen_sar_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
        break;
    case OPC_DSRLV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x3f);
        tcg_gen_shr_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
        break;
    case OPC_DROTRV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x3f);
        tcg_gen_rotr_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}